

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fancyscene.cpp
# Opt level: O3

void __thiscall graphics101::FancyScene::setPerspectiveMatrix(FancyScene *this)

{
  Drawable *pDVar1;
  mapped_type *pmVar2;
  mat4 projection;
  key_type local_88;
  mat4 local_68;
  
  (*gl3wProcs.ptr[0xd9])(0xba2,&local_68);
  if ((this->m_drawable)._M_t.
      super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>._M_t
      .super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>.
      super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl != (Drawable *)0x0) {
    Camera::perspective_matrix_for_unit_cube
              (&local_68,(int)local_68.value[0].field_2,(int)local_68.value[0].field_3,3.0);
    pDVar1 = (this->m_drawable)._M_t.
             super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
             ._M_t.
             super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
             .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"uProjectionMatrix","");
    pmVar2 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(pDVar1->uniforms).m_uniforms_mat4,&local_88);
    pmVar2->value[3].field_0 = local_68.value[3].field_0;
    pmVar2->value[3].field_1 = local_68.value[3].field_1;
    pmVar2->value[3].field_2 = local_68.value[3].field_2;
    pmVar2->value[3].field_3 = local_68.value[3].field_3;
    pmVar2->value[2].field_0 = local_68.value[2].field_0;
    pmVar2->value[2].field_1 = local_68.value[2].field_1;
    pmVar2->value[2].field_2 = local_68.value[2].field_2;
    pmVar2->value[2].field_3 = local_68.value[2].field_3;
    pmVar2->value[1].field_0 = local_68.value[1].field_0;
    pmVar2->value[1].field_1 = local_68.value[1].field_1;
    pmVar2->value[1].field_2 = local_68.value[1].field_2;
    pmVar2->value[1].field_3 = local_68.value[1].field_3;
    pmVar2->value[0].field_0 = local_68.value[0].field_0;
    pmVar2->value[0].field_1 = local_68.value[0].field_1;
    pmVar2->value[0].field_2 = local_68.value[0].field_2;
    pmVar2->value[0].field_3 = local_68.value[0].field_3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    KinematicsVisualizer::setProjectionMatrix(&this->m_skelview,&local_68);
    return;
  }
  __assert_fail("m_drawable",
                "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/fancyscene.cpp"
                ,0x180,"void graphics101::FancyScene::setPerspectiveMatrix()");
}

Assistant:

void FancyScene::setPerspectiveMatrix() {
    const auto width_and_height = window_dimensions();
    const int w = width_and_height[0];
    const int h = width_and_height[1];
    
    // We want to set uniforms. We need a drawable.
    assert( m_drawable );
    
    // The perspective matrix projects camera coordinates to canonical device coordinates.
    const mat4 projection = Camera::perspective_matrix_for_unit_cube( w, h, 3 );
    m_drawable->uniforms.storeUniform( "uProjectionMatrix", projection );
    
    // Also update the skeleton visualizer.
    m_skelview.setProjectionMatrix( projection );
}